

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcUnroll.c
# Opt level: O1

Gia_Man_t * Unr_ManUnrollSimple(Gia_Man_t *pGia,int nFrames)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *__s;
  Gia_Obj_t *pGVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  int iVar7;
  Gia_Man_t *p;
  size_t sVar8;
  char *__dest;
  Gia_Obj_t *pGVar9;
  Vec_Int_t *pVVar10;
  Gia_Man_t *pGVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  Gia_Obj_t *pGVar18;
  
  p = Gia_ManStart(10000);
  __s = pGia->pName;
  if (__s == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar8 = strlen(__s);
    __dest = (char *)malloc(sVar8 + 1);
    strcpy(__dest,__s);
  }
  p->pName = __dest;
  Gia_ManHashAlloc(p);
  pGVar18 = pGia->pObjs;
  pGVar18->Value = 0;
  lVar13 = (long)pGia->nRegs;
  if (0 < lVar13) {
    pVVar10 = pGia->vCos;
    iVar7 = pVVar10->nSize;
    uVar16 = (ulong)(uint)(iVar7 - pGia->nRegs);
    do {
      if (((int)uVar16 < 0) || (iVar7 <= (int)uVar16)) {
LAB_005b0d55:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar14 = pVVar10->pArray[uVar16];
      if (((long)iVar14 < 0) || (pGia->nObjs <= iVar14)) {
LAB_005b0d17:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (pGVar18 == (Gia_Obj_t *)0x0) break;
      pGVar18[iVar14].Value = 0;
      uVar16 = uVar16 + 1;
      lVar13 = lVar13 + -1;
    } while (lVar13 != 0);
  }
  if (0 < nFrames) {
    iVar7 = 0;
    do {
      pVVar10 = pGia->vCis;
      iVar14 = pVVar10->nSize;
      uVar17 = pGia->nRegs;
      uVar16 = (ulong)uVar17;
      iVar12 = iVar14 - uVar17;
      if (iVar12 != 0 && (int)uVar17 <= iVar14) {
        lVar13 = 0;
        do {
          if (iVar14 <= lVar13) goto LAB_005b0d55;
          iVar1 = pVVar10->pArray[lVar13];
          if (((long)iVar1 < 0) || (pGia->nObjs <= iVar1)) goto LAB_005b0d17;
          pGVar18 = pGia->pObjs;
          if (pGVar18 == (Gia_Obj_t *)0x0) break;
          pGVar9 = Gia_ManAppendObj(p);
          uVar16 = *(ulong *)pGVar9;
          *(ulong *)pGVar9 = uVar16 | 0x9fffffff;
          *(ulong *)pGVar9 =
               uVar16 & 0xe0000000ffffffff | 0x9fffffff |
               (ulong)(p->vCis->nSize & 0x1fffffff) << 0x20;
          pGVar4 = p->pObjs;
          if ((pGVar9 < pGVar4) || (pGVar4 + p->nObjs <= pGVar9)) {
LAB_005b0d36:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          Vec_IntPush(p->vCis,(int)((ulong)((long)pGVar9 - (long)pGVar4) >> 2) * -0x55555555);
          pGVar4 = p->pObjs;
          if ((pGVar9 < pGVar4) || (pGVar4 + p->nObjs <= pGVar9)) goto LAB_005b0d36;
          pGVar18[iVar1].Value = (int)((ulong)((long)pGVar9 - (long)pGVar4) >> 2) * 0x55555556;
          lVar13 = lVar13 + 1;
          pVVar10 = pGia->vCis;
          iVar14 = pVVar10->nSize;
          uVar16 = (ulong)(uint)pGia->nRegs;
          iVar12 = iVar14 - pGia->nRegs;
        } while (lVar13 < iVar12);
      }
      if (0 < (int)uVar16) {
        pVVar5 = pGia->vCos;
        iVar1 = pVVar5->nSize;
        uVar17 = iVar1 - (int)uVar16;
        lVar13 = (long)iVar12;
        do {
          if (((int)uVar17 < 0) || (iVar1 <= (int)uVar17)) goto LAB_005b0d55;
          iVar2 = pVVar5->pArray[uVar17];
          if (((long)iVar2 < 0) || (pGia->nObjs <= iVar2)) goto LAB_005b0d17;
          pGVar18 = pGia->pObjs;
          if (pGVar18 == (Gia_Obj_t *)0x0) break;
          if ((iVar12 < 0) || (iVar14 <= lVar13)) goto LAB_005b0d55;
          iVar3 = pVVar10->pArray[lVar13];
          if (((long)iVar3 < 0) || (pGia->nObjs <= iVar3)) goto LAB_005b0d17;
          pGVar18[iVar3].Value = pGVar18[iVar2].Value;
          lVar13 = lVar13 + 1;
          uVar17 = uVar17 + 1;
          uVar16 = uVar16 - 1;
        } while (uVar16 != 0);
      }
      iVar14 = pGia->nObjs;
      if ((0 < iVar14) && (pGVar18 = pGia->pObjs, pGVar18 != (Gia_Obj_t *)0x0)) {
        lVar13 = 0;
        do {
          uVar16 = *(ulong *)pGVar18;
          if ((uVar16 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar16) {
            if (((int)pGVar18[-(uVar16 & 0x1fffffff)].Value < 0) ||
               (uVar17 = (uint)(uVar16 >> 0x20),
               (int)pGVar18[-(ulong)(uVar17 & 0x1fffffff)].Value < 0)) goto LAB_005b0d74;
            uVar17 = Gia_ManHashAnd(p,pGVar18[-(uVar16 & 0x1fffffff)].Value ^
                                      (uint)(uVar16 >> 0x1d) & 1,
                                    pGVar18[-(ulong)(uVar17 & 0x1fffffff)].Value ^
                                    uVar17 >> 0x1d & 1);
            pGVar18->Value = uVar17;
          }
          lVar13 = lVar13 + 1;
          iVar14 = pGia->nObjs;
        } while ((lVar13 < iVar14) &&
                (pGVar18 = pGia->pObjs + lVar13, pGia->pObjs != (Gia_Obj_t *)0x0));
      }
      lVar13 = (long)pGia->vCos->nSize;
      if (0 < lVar13) {
        piVar6 = pGia->vCos->pArray;
        lVar15 = 0;
        do {
          iVar12 = piVar6[lVar15];
          if (((long)iVar12 < 0) || (iVar14 <= iVar12)) goto LAB_005b0d17;
          if (pGia->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar18 = pGia->pObjs + iVar12;
          if ((int)pGVar18[-(ulong)((uint)*(undefined8 *)pGVar18 & 0x1fffffff)].Value < 0) {
LAB_005b0d74:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x132,"int Abc_LitNotCond(int, int)");
          }
          pGVar18->Value =
               (uint)*(undefined8 *)pGVar18 >> 0x1d & 1 ^
               pGVar18[-(ulong)((uint)*(undefined8 *)pGVar18 & 0x1fffffff)].Value;
          lVar15 = lVar15 + 1;
        } while (lVar13 != lVar15);
      }
      pVVar10 = pGia->vCos;
      uVar16 = (ulong)(uint)pVVar10->nSize;
      if (pGia->nRegs < pVVar10->nSize) {
        lVar13 = 0;
        do {
          if ((int)uVar16 <= lVar13) goto LAB_005b0d55;
          iVar14 = pVVar10->pArray[lVar13];
          if (((long)iVar14 < 0) || (pGia->nObjs <= iVar14)) goto LAB_005b0d17;
          if (pGia->pObjs == (Gia_Obj_t *)0x0) break;
          Gia_ManAppendCo(p,pGia->pObjs[iVar14].Value);
          lVar13 = lVar13 + 1;
          pVVar10 = pGia->vCos;
          uVar16 = (ulong)pVVar10->nSize;
        } while (lVar13 < (long)(uVar16 - (long)pGia->nRegs));
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 != nFrames);
  }
  Gia_ManHashStop(p);
  Gia_ManSetRegNum(p,0);
  pGVar11 = Gia_ManCleanup(p);
  Gia_ManStop(p);
  return pGVar11;
}

Assistant:

Gia_Man_t * Unr_ManUnrollSimple( Gia_Man_t * pGia, int nFrames )
{
    Gia_Man_t * pFrames;
    Gia_Obj_t * pObj, * pObjRi;
    int f, i; 
    pFrames = Gia_ManStart( 10000 );
    pFrames->pName = Abc_UtilStrsav( pGia->pName );
    Gia_ManHashAlloc( pFrames );
    Gia_ManConst0(pGia)->Value = 0;
    Gia_ManForEachRi( pGia, pObj, i )
        pObj->Value = 0;
    for ( f = 0; f < nFrames; f++ )
    {
        Gia_ManForEachPi( pGia, pObj, i )
            pObj->Value = Gia_ManAppendCi(pFrames);
        Gia_ManForEachRiRo( pGia, pObjRi, pObj, i )
            pObj->Value = pObjRi->Value;
        Gia_ManForEachAnd( pGia, pObj, i )
            pObj->Value = Gia_ManHashAnd( pFrames, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        Gia_ManForEachCo( pGia, pObj, i )
            pObj->Value = Gia_ObjFanin0Copy(pObj);
        Gia_ManForEachPo( pGia, pObj, i )
            Gia_ManAppendCo( pFrames, pObj->Value );
    }
    Gia_ManHashStop( pFrames );
    Gia_ManSetRegNum( pFrames, 0 );
    pFrames = Gia_ManCleanup( pGia = pFrames );
    Gia_ManStop( pGia );
    return pFrames;
}